

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void ClipperLib::SwapX(TEdge *e)

{
  TEdge *e_local;
  
  e->xcurr = e->xtop;
  e->xtop = e->xbot;
  e->xbot = e->xcurr;
  return;
}

Assistant:

inline void SwapX(TEdge &e)
{
  //swap horizontal edges' top and bottom x's so they follow the natural
  //progression of the bounds - ie so their xbots will align with the
  //adjoining lower edge. [Helpful in the ProcessHorizontal() method.]
  e.xcurr = e.xtop;
  e.xtop = e.xbot;
  e.xbot = e.xcurr;
}